

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_aggsig_generate_nonce
              (secp256k1_context *ctx,secp256k1_aggsig_context *aggctx,size_t index)

{
  int iVar1;
  secp256k1_rfc6979_hmac_sha256 *rng;
  void *pvVar2;
  char *pcVar3;
  secp256k1_gej pubnon;
  
  if ((ctx->ecmult_gen_ctx).prec == (secp256k1_ge_storage (*) [64] [16])0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)";
  }
  else {
    if (index < aggctx->n_sigs) {
      if (aggctx->progress[index] != NONCE_PROGRESS_UNKNOWN) {
        return 0;
      }
      rng = &aggctx->rng;
      iVar1 = secp256k1_aggsig_generate_nonce_single(ctx,aggctx->secnonce + index,&pubnon,rng);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_gej_add_var(&aggctx->pubnonce_sum,&aggctx->pubnonce_sum,&pubnon,(secp256k1_fe *)rng)
      ;
      aggctx->progress[index] = NONCE_PROGRESS_OURS;
      return 1;
    }
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "index < aggctx->n_sigs";
  }
  (*(ctx->illegal_callback).fn)(pcVar3,pvVar2);
  return 0;
}

Assistant:

int secp256k1_aggsig_generate_nonce(const secp256k1_context* ctx, secp256k1_aggsig_context* aggctx, size_t index) {
    secp256k1_gej pubnon;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(aggctx != NULL);
    ARG_CHECK(index < aggctx->n_sigs);

    if (aggctx->progress[index] != NONCE_PROGRESS_UNKNOWN) {
        return 0;
    }
    if (secp256k1_aggsig_generate_nonce_single(ctx, &aggctx->secnonce[index], &pubnon, &aggctx->rng) == 0){
        return 0;
    }

    secp256k1_gej_add_var(&aggctx->pubnonce_sum, &aggctx->pubnonce_sum, &pubnon, NULL);
    aggctx->progress[index] = NONCE_PROGRESS_OURS;
    return 1;
}